

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void variance_partition_alloc(AV1_COMP *cpi)

{
  int iVar1;
  void *memblk;
  void *pvVar2;
  long in_RDI;
  int num_64x64_blocks;
  AV1_COMMON *cm;
  
  memblk = (void *)(in_RDI + 0x3bf80);
  iVar1 = 4;
  if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x1c) == '\f') {
    iVar1 = 1;
  }
  if ((*(long *)(in_RDI + 0x3ada8) != 0) && (iVar1 != *(int *)(in_RDI + 0x3adb0))) {
    aom_free(memblk);
    *(undefined8 *)(in_RDI + 0x3ada8) = 0;
  }
  if (*(long *)(in_RDI + 0x3ada8) == 0) {
    pvVar2 = aom_malloc(0x22fc32);
    *(void **)(in_RDI + 0x3ada8) = pvVar2;
    if (*(long *)(in_RDI + 0x3ada8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)((long)memblk + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->td.vt64x64");
    }
    *(int *)(in_RDI + 0x3adb0) = iVar1;
  }
  return;
}

Assistant:

static inline void variance_partition_alloc(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_64x64_blocks = (cm->seq_params->sb_size == BLOCK_64X64) ? 1 : 4;
  if (cpi->td.vt64x64) {
    if (num_64x64_blocks != cpi->td.num_64x64_blocks) {
      aom_free(cpi->td.vt64x64);
      cpi->td.vt64x64 = NULL;
    }
  }
  if (!cpi->td.vt64x64) {
    CHECK_MEM_ERROR(cm, cpi->td.vt64x64,
                    aom_malloc(sizeof(*cpi->td.vt64x64) * num_64x64_blocks));
    cpi->td.num_64x64_blocks = num_64x64_blocks;
  }
}